

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

int __thiscall kwssys::RegExpFind::regrepeat(RegExpFind *this,char *p)

{
  char *__s;
  size_t sVar1;
  char *pcVar2;
  undefined1 *in_RSI;
  undefined8 *in_RDI;
  bool bVar3;
  char *opnd;
  char *scan;
  int count;
  char *local_28;
  int local_1c;
  
  local_1c = 0;
  local_28 = (char *)*in_RDI;
  __s = in_RSI + 3;
  switch(*in_RSI) {
  case 3:
    sVar1 = strlen(local_28);
    local_1c = (int)sVar1;
    local_28 = local_28 + local_1c;
    break;
  case 4:
    while( true ) {
      bVar3 = false;
      if (*local_28 != '\0') {
        pcVar2 = strchr(__s,(int)*local_28);
        bVar3 = pcVar2 != (char *)0x0;
      }
      if (!bVar3) break;
      local_1c = local_1c + 1;
      local_28 = local_28 + 1;
    }
    break;
  case 5:
    while( true ) {
      bVar3 = false;
      if (*local_28 != '\0') {
        pcVar2 = strchr(__s,(int)*local_28);
        bVar3 = pcVar2 == (char *)0x0;
      }
      if (!bVar3) break;
      local_1c = local_1c + 1;
      local_28 = local_28 + 1;
    }
    break;
  default:
    printf("cm RegularExpression::find(): Internal error.\n");
    return 0;
  case 8:
    for (; *__s == *local_28; local_28 = local_28 + 1) {
      local_1c = local_1c + 1;
    }
  }
  *in_RDI = local_28;
  return local_1c;
}

Assistant:

int RegExpFind::regrepeat(const char* p)
{
  int count = 0;
  const char* scan;
  const char* opnd;

  scan = reginput;
  opnd = OPERAND(p);
  switch (OP(p)) {
    case ANY:
      count = int(strlen(scan));
      scan += count;
      break;
    case EXACTLY:
      while (*opnd == *scan) {
        count++;
        scan++;
      }
      break;
    case ANYOF:
      while (*scan != '\0' && strchr(opnd, *scan) != nullptr) {
        count++;
        scan++;
      }
      break;
    case ANYBUT:
      while (*scan != '\0' && strchr(opnd, *scan) == nullptr) {
        count++;
        scan++;
      }
      break;
    default: // Oh dear.  Called inappropriately.
      // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
      printf("cm RegularExpression::find(): Internal error.\n");
      return 0;
  }
  reginput = scan;
  return (count);
}